

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O3

void roguejoin(level *lev,int x1,int y1,int x2,int y2,int horiz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  uint uVar153;
  int iVar154;
  long lVar155;
  schar *psVar156;
  long lVar157;
  long lVar158;
  ulong uVar159;
  ulong uVar160;
  int iVar216;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  int iVar217;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  int iVar281;
  int iVar294;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  int iVar282;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  int iVar363;
  int iVar384;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  
  uVar153 = mt_random();
  auVar152 = _DAT_002ae020;
  auVar151 = _DAT_002ae010;
  auVar150 = _DAT_002ae000;
  auVar149 = _DAT_002adff0;
  auVar148 = _DAT_002adfe0;
  auVar147 = _DAT_002aba20;
  auVar146 = _DAT_002aba10;
  lVar155 = (long)x1;
  lVar158 = (long)y1;
  if (horiz == 0) {
    uVar160 = 0;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = CONCAT44(0,uVar153);
    iVar282 = SUB164(auVar162 % SEXT816((long)((y2 - y1) + 1)),0);
    iVar154 = iVar282 + y1;
    iVar281 = iVar154;
    if (iVar154 < y1) {
      iVar281 = y1;
    }
    uVar153 = iVar281 - y1;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = CONCAT44(0,uVar153);
    psVar156 = &lev->locations[lVar155][lVar158 + 0xf].typ;
    do {
      auVar275._8_4_ = (int)uVar160;
      auVar275._0_8_ = uVar160;
      auVar275._12_4_ = (int)(uVar160 >> 0x20);
      auVar218._4_4_ = 0;
      auVar218._0_4_ = uVar153;
      auVar218._8_4_ = uVar153;
      auVar218._12_4_ = 0;
      auVar218 = auVar218 ^ auVar147;
      auVar329 = (auVar275 | auVar146) ^ auVar147;
      iVar281 = auVar218._0_4_;
      iVar363 = -(uint)(iVar281 < auVar329._0_4_);
      iVar294 = auVar218._4_4_;
      auVar331._4_4_ = -(uint)(iVar294 < auVar329._4_4_);
      iVar216 = auVar218._8_4_;
      iVar384 = -(uint)(iVar216 < auVar329._8_4_);
      iVar217 = auVar218._12_4_;
      auVar331._12_4_ = -(uint)(iVar217 < auVar329._12_4_);
      auVar104._4_4_ = iVar363;
      auVar104._0_4_ = iVar363;
      auVar104._8_4_ = iVar384;
      auVar104._12_4_ = iVar384;
      auVar162 = pshuflw(auVar295,auVar104,0xe8);
      auVar330._4_4_ = -(uint)(auVar329._4_4_ == iVar294);
      auVar330._12_4_ = -(uint)(auVar329._12_4_ == iVar217);
      auVar330._0_4_ = auVar330._4_4_;
      auVar330._8_4_ = auVar330._12_4_;
      auVar218 = pshuflw(in_XMM1,auVar330,0xe8);
      auVar331._0_4_ = auVar331._4_4_;
      auVar331._8_4_ = auVar331._12_4_;
      auVar295 = pshuflw(auVar162,auVar331,0xe8);
      auVar329._8_4_ = 0xffffffff;
      auVar329._0_8_ = 0xffffffffffffffff;
      auVar329._12_4_ = 0xffffffff;
      auVar329 = (auVar295 | auVar218 & auVar162) ^ auVar329;
      auVar162 = packssdw(auVar329,auVar329);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0xb4] = 0x18;
      }
      auVar105._4_4_ = iVar363;
      auVar105._0_4_ = iVar363;
      auVar105._8_4_ = iVar384;
      auVar105._12_4_ = iVar384;
      auVar331 = auVar330 & auVar105 | auVar331;
      auVar162 = packssdw(auVar331,auVar331);
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar32,auVar162 ^ auVar32);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 8 & 1) != 0) {
        psVar156[-0xa8] = 0x18;
      }
      auVar162 = (auVar275 | auVar152) ^ auVar147;
      auVar244._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar244._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar244._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar244._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar332._4_4_ = auVar244._0_4_;
      auVar332._0_4_ = auVar244._0_4_;
      auVar332._8_4_ = auVar244._8_4_;
      auVar332._12_4_ = auVar244._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar106._4_4_ = iVar363;
      auVar106._0_4_ = iVar363;
      auVar106._8_4_ = iVar384;
      auVar106._12_4_ = iVar384;
      auVar374._4_4_ = auVar244._4_4_;
      auVar374._0_4_ = auVar244._4_4_;
      auVar374._8_4_ = auVar244._12_4_;
      auVar374._12_4_ = auVar244._12_4_;
      auVar162 = auVar106 & auVar332 | auVar374;
      auVar162 = packssdw(auVar162,auVar162);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar33,auVar162 ^ auVar33);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x10 & 1) != 0) {
        psVar156[-0x9c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar332,0x84);
      auVar107._4_4_ = iVar363;
      auVar107._0_4_ = iVar363;
      auVar107._8_4_ = iVar384;
      auVar107._12_4_ = iVar384;
      auVar218 = pshufhw(auVar244,auVar107,0x84);
      auVar295 = pshufhw(auVar162,auVar374,0x84);
      auVar190._8_4_ = 0xffffffff;
      auVar190._0_8_ = 0xffffffffffffffff;
      auVar190._12_4_ = 0xffffffff;
      auVar190 = (auVar295 | auVar218 & auVar162) ^ auVar190;
      auVar162 = packssdw(auVar190,auVar190);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x18 & 1) != 0) {
        psVar156[-0x90] = 0x18;
      }
      auVar162 = (auVar275 | auVar151) ^ auVar147;
      auVar245._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar245._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar245._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar245._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar108._4_4_ = auVar245._0_4_;
      auVar108._0_4_ = auVar245._0_4_;
      auVar108._8_4_ = auVar245._8_4_;
      auVar108._12_4_ = auVar245._8_4_;
      auVar218 = pshuflw(auVar374,auVar108,0xe8);
      auVar191._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar191._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar191._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar191._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar333._4_4_ = auVar191._4_4_;
      auVar333._0_4_ = auVar191._4_4_;
      auVar333._8_4_ = auVar191._12_4_;
      auVar333._12_4_ = auVar191._12_4_;
      auVar162 = pshuflw(auVar191,auVar333,0xe8);
      auVar334._4_4_ = auVar245._4_4_;
      auVar334._0_4_ = auVar245._4_4_;
      auVar334._8_4_ = auVar245._12_4_;
      auVar334._12_4_ = auVar245._12_4_;
      auVar295 = pshuflw(auVar245,auVar334,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar34);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x84] = 0x18;
      }
      auVar109._4_4_ = auVar245._0_4_;
      auVar109._0_4_ = auVar245._0_4_;
      auVar109._8_4_ = auVar245._8_4_;
      auVar109._12_4_ = auVar245._8_4_;
      auVar334 = auVar333 & auVar109 | auVar334;
      auVar295 = packssdw(auVar334,auVar334);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar35);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._4_2_ >> 8 & 1) != 0) {
        psVar156[-0x78] = 0x18;
      }
      auVar162 = (auVar275 | auVar150) ^ auVar147;
      auVar246._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar246._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar246._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar246._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar335._4_4_ = auVar246._0_4_;
      auVar335._0_4_ = auVar246._0_4_;
      auVar335._8_4_ = auVar246._8_4_;
      auVar335._12_4_ = auVar246._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar110._4_4_ = iVar363;
      auVar110._0_4_ = iVar363;
      auVar110._8_4_ = iVar384;
      auVar110._12_4_ = iVar384;
      auVar375._4_4_ = auVar246._4_4_;
      auVar375._0_4_ = auVar246._4_4_;
      auVar375._8_4_ = auVar246._12_4_;
      auVar375._12_4_ = auVar246._12_4_;
      auVar162 = auVar110 & auVar335 | auVar375;
      auVar162 = packssdw(auVar162,auVar162);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar36,auVar162 ^ auVar36);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0x6c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar335,0x84);
      auVar111._4_4_ = iVar363;
      auVar111._0_4_ = iVar363;
      auVar111._8_4_ = iVar384;
      auVar111._12_4_ = iVar384;
      auVar218 = pshufhw(auVar246,auVar111,0x84);
      auVar295 = pshufhw(auVar162,auVar375,0x84);
      auVar192._8_4_ = 0xffffffff;
      auVar192._0_8_ = 0xffffffffffffffff;
      auVar192._12_4_ = 0xffffffff;
      auVar192 = (auVar295 | auVar218 & auVar162) ^ auVar192;
      auVar162 = packssdw(auVar192,auVar192);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._6_2_ >> 8 & 1) != 0) {
        psVar156[-0x60] = 0x18;
      }
      auVar162 = (auVar275 | auVar149) ^ auVar147;
      auVar247._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar247._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar247._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar247._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar112._4_4_ = auVar247._0_4_;
      auVar112._0_4_ = auVar247._0_4_;
      auVar112._8_4_ = auVar247._8_4_;
      auVar112._12_4_ = auVar247._8_4_;
      auVar218 = pshuflw(auVar375,auVar112,0xe8);
      auVar193._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar193._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar193._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar193._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar336._4_4_ = auVar193._4_4_;
      auVar336._0_4_ = auVar193._4_4_;
      auVar336._8_4_ = auVar193._12_4_;
      auVar336._12_4_ = auVar193._12_4_;
      auVar162 = pshuflw(auVar193,auVar336,0xe8);
      auVar337._4_4_ = auVar247._4_4_;
      auVar337._0_4_ = auVar247._4_4_;
      auVar337._8_4_ = auVar247._12_4_;
      auVar337._12_4_ = auVar247._12_4_;
      auVar295 = pshuflw(auVar247,auVar337,0xe8);
      auVar248._8_4_ = 0xffffffff;
      auVar248._0_8_ = 0xffffffffffffffff;
      auVar248._12_4_ = 0xffffffff;
      auVar248 = (auVar295 | auVar162 & auVar218) ^ auVar248;
      auVar295 = packssdw(auVar248,auVar248);
      auVar162 = packsswb(auVar162 & auVar218,auVar295);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0x54] = 0x18;
      }
      auVar113._4_4_ = auVar247._0_4_;
      auVar113._0_4_ = auVar247._0_4_;
      auVar113._8_4_ = auVar247._8_4_;
      auVar113._12_4_ = auVar247._8_4_;
      auVar337 = auVar336 & auVar113 | auVar337;
      auVar295 = packssdw(auVar337,auVar337);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar295 = packssdw(auVar295 ^ auVar37,auVar295 ^ auVar37);
      auVar162 = packsswb(auVar162,auVar295);
      if ((auVar162._8_2_ >> 8 & 1) != 0) {
        psVar156[-0x48] = 0x18;
      }
      auVar162 = (auVar275 | auVar148) ^ auVar147;
      auVar249._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar249._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar249._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar249._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar338._4_4_ = auVar249._0_4_;
      auVar338._0_4_ = auVar249._0_4_;
      auVar338._8_4_ = auVar249._8_4_;
      auVar338._12_4_ = auVar249._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar114._4_4_ = iVar363;
      auVar114._0_4_ = iVar363;
      auVar114._8_4_ = iVar384;
      auVar114._12_4_ = iVar384;
      auVar376._4_4_ = auVar249._4_4_;
      auVar376._0_4_ = auVar249._4_4_;
      auVar376._8_4_ = auVar249._12_4_;
      auVar376._12_4_ = auVar249._12_4_;
      auVar162 = auVar114 & auVar338 | auVar376;
      auVar162 = packssdw(auVar162,auVar162);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar38,auVar162 ^ auVar38);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar156[-0x3c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar338,0x84);
      auVar115._4_4_ = iVar363;
      auVar115._0_4_ = iVar363;
      auVar115._8_4_ = iVar384;
      auVar115._12_4_ = iVar384;
      auVar218 = pshufhw(auVar249,auVar115,0x84);
      auVar295 = pshufhw(auVar162,auVar376,0x84);
      auVar194._8_4_ = 0xffffffff;
      auVar194._0_8_ = 0xffffffffffffffff;
      auVar194._12_4_ = 0xffffffff;
      auVar194 = (auVar295 | auVar218 & auVar162) ^ auVar194;
      auVar162 = packssdw(auVar194,auVar194);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._10_2_ >> 8 & 1) != 0) {
        psVar156[-0x30] = 0x18;
      }
      auVar162 = (auVar275 | _DAT_002adfd0) ^ auVar147;
      auVar250._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar250._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar250._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar250._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar116._4_4_ = auVar250._0_4_;
      auVar116._0_4_ = auVar250._0_4_;
      auVar116._8_4_ = auVar250._8_4_;
      auVar116._12_4_ = auVar250._8_4_;
      auVar218 = pshuflw(auVar376,auVar116,0xe8);
      auVar195._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar195._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar195._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar195._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar339._4_4_ = auVar195._4_4_;
      auVar339._0_4_ = auVar195._4_4_;
      auVar339._8_4_ = auVar195._12_4_;
      auVar339._12_4_ = auVar195._12_4_;
      auVar162 = pshuflw(auVar195,auVar339,0xe8);
      auVar377._4_4_ = auVar250._4_4_;
      auVar377._0_4_ = auVar250._4_4_;
      auVar377._8_4_ = auVar250._12_4_;
      auVar377._12_4_ = auVar250._12_4_;
      auVar295 = pshuflw(auVar250,auVar377,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar39);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x24] = 0x18;
      }
      auVar117._4_4_ = auVar250._0_4_;
      auVar117._0_4_ = auVar250._0_4_;
      auVar117._8_4_ = auVar250._8_4_;
      auVar117._12_4_ = auVar250._8_4_;
      auVar295 = auVar339 & auVar117 | auVar377;
      auVar295 = packssdw(auVar295,auVar295);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar40);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._12_2_ >> 8 & 1) != 0) {
        psVar156[-0x18] = 0x18;
      }
      auVar162 = (auVar275 | _DAT_002adfc0) ^ auVar147;
      auVar196._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar196._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar196._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar196._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar340._4_4_ = auVar196._0_4_;
      auVar340._0_4_ = auVar196._0_4_;
      auVar340._8_4_ = auVar196._8_4_;
      auVar340._12_4_ = auVar196._8_4_;
      auVar276._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar276._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar276._0_4_ = auVar276._4_4_;
      auVar276._8_4_ = auVar276._12_4_;
      auVar289._4_4_ = auVar196._4_4_;
      auVar289._0_4_ = auVar196._4_4_;
      auVar289._8_4_ = auVar196._12_4_;
      auVar289._12_4_ = auVar196._12_4_;
      auVar295 = auVar276 & auVar340 | auVar289;
      auVar162 = packssdw(auVar196,auVar295);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar41,auVar162 ^ auVar41);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0xc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar340,0x84);
      in_XMM1 = pshufhw(auVar295,auVar276,0x84);
      in_XMM1 = in_XMM1 & auVar162;
      auVar162 = pshufhw(auVar162,auVar289,0x84);
      auVar197._8_4_ = 0xffffffff;
      auVar197._0_8_ = 0xffffffffffffffff;
      auVar197._12_4_ = 0xffffffff;
      auVar197 = (auVar162 | in_XMM1) ^ auVar197;
      auVar162 = packssdw(auVar197,auVar197);
      auVar295 = packsswb(auVar162,auVar162);
      if ((auVar295._14_2_ >> 8 & 1) != 0) {
        *psVar156 = '\x18';
      }
      uVar160 = uVar160 + 0x10;
      psVar156 = psVar156 + 0xc0;
    } while ((CONCAT44(0,uVar153) + 0x10 & 0x1fffffff0) != uVar160);
    lVar157 = (long)x2;
    lVar158 = lVar155;
    if (lVar157 < lVar155) {
      lVar158 = lVar157;
    }
    uVar159 = lVar155 - lVar157;
    uVar160 = -uVar159;
    if (0 < (long)uVar159) {
      uVar160 = uVar159;
    }
    psVar156 = &lev->locations[lVar158 + 0xf][iVar154].typ;
    uVar159 = 0;
    do {
      auVar277._8_4_ = (int)uVar159;
      auVar277._0_8_ = uVar159;
      auVar277._12_4_ = (int)(uVar159 >> 0x20);
      auVar290._8_4_ = (int)uVar160;
      auVar290._0_8_ = uVar160 & 0xffffffff;
      auVar290._12_4_ = 0;
      auVar290 = auVar290 ^ auVar147;
      auVar162 = (auVar277 | auVar146) ^ auVar147;
      iVar281 = auVar290._0_4_;
      auVar251._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      iVar294 = auVar290._4_4_;
      auVar251._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      iVar216 = auVar290._8_4_;
      auVar251._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      iVar217 = auVar290._12_4_;
      auVar251._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar118._4_4_ = auVar251._0_4_;
      auVar118._0_4_ = auVar251._0_4_;
      auVar118._8_4_ = auVar251._8_4_;
      auVar118._12_4_ = auVar251._8_4_;
      auVar218 = pshuflw(auVar377,auVar118,0xe8);
      auVar198._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar198._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar198._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar198._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar341._4_4_ = auVar198._4_4_;
      auVar341._0_4_ = auVar198._4_4_;
      auVar341._8_4_ = auVar198._12_4_;
      auVar341._12_4_ = auVar198._12_4_;
      auVar162 = pshuflw(auVar198,auVar341,0xe8);
      auVar342._4_4_ = auVar251._4_4_;
      auVar342._0_4_ = auVar251._4_4_;
      auVar342._8_4_ = auVar251._12_4_;
      auVar342._12_4_ = auVar251._12_4_;
      auVar295 = pshuflw(auVar251,auVar342,0xe8);
      auVar252._8_4_ = 0xffffffff;
      auVar252._0_8_ = 0xffffffffffffffff;
      auVar252._12_4_ = 0xffffffff;
      auVar252 = (auVar295 | auVar162 & auVar218) ^ auVar252;
      auVar162 = packssdw(auVar252,auVar252);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0xec4] = 0x18;
      }
      auVar119._4_4_ = auVar251._0_4_;
      auVar119._0_4_ = auVar251._0_4_;
      auVar119._8_4_ = auVar251._8_4_;
      auVar119._12_4_ = auVar251._8_4_;
      auVar342 = auVar341 & auVar119 | auVar342;
      auVar162 = packssdw(auVar342,auVar342);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar42,auVar162 ^ auVar42);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 8 & 1) != 0) {
        psVar156[-0xdc8] = 0x18;
      }
      auVar162 = (auVar277 | auVar152) ^ auVar147;
      auVar253._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar253._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar253._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar253._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar343._4_4_ = auVar253._0_4_;
      auVar343._0_4_ = auVar253._0_4_;
      auVar343._8_4_ = auVar253._8_4_;
      auVar343._12_4_ = auVar253._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar120._4_4_ = iVar363;
      auVar120._0_4_ = iVar363;
      auVar120._8_4_ = iVar384;
      auVar120._12_4_ = iVar384;
      auVar378._4_4_ = auVar253._4_4_;
      auVar378._0_4_ = auVar253._4_4_;
      auVar378._8_4_ = auVar253._12_4_;
      auVar378._12_4_ = auVar253._12_4_;
      auVar162 = auVar120 & auVar343 | auVar378;
      auVar162 = packssdw(auVar162,auVar162);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar43,auVar162 ^ auVar43);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x10 & 1) != 0) {
        psVar156[-0xccc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar343,0x84);
      auVar121._4_4_ = iVar363;
      auVar121._0_4_ = iVar363;
      auVar121._8_4_ = iVar384;
      auVar121._12_4_ = iVar384;
      auVar218 = pshufhw(auVar253,auVar121,0x84);
      auVar295 = pshufhw(auVar162,auVar378,0x84);
      auVar199._8_4_ = 0xffffffff;
      auVar199._0_8_ = 0xffffffffffffffff;
      auVar199._12_4_ = 0xffffffff;
      auVar199 = (auVar295 | auVar218 & auVar162) ^ auVar199;
      auVar162 = packssdw(auVar199,auVar199);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x18 & 1) != 0) {
        psVar156[-0xbd0] = 0x18;
      }
      auVar162 = (auVar277 | auVar151) ^ auVar147;
      auVar254._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar254._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar254._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar254._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar122._4_4_ = auVar254._0_4_;
      auVar122._0_4_ = auVar254._0_4_;
      auVar122._8_4_ = auVar254._8_4_;
      auVar122._12_4_ = auVar254._8_4_;
      auVar218 = pshuflw(auVar378,auVar122,0xe8);
      auVar200._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar200._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar200._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar200._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar344._4_4_ = auVar200._4_4_;
      auVar344._0_4_ = auVar200._4_4_;
      auVar344._8_4_ = auVar200._12_4_;
      auVar344._12_4_ = auVar200._12_4_;
      auVar162 = pshuflw(auVar200,auVar344,0xe8);
      auVar345._4_4_ = auVar254._4_4_;
      auVar345._0_4_ = auVar254._4_4_;
      auVar345._8_4_ = auVar254._12_4_;
      auVar345._12_4_ = auVar254._12_4_;
      auVar295 = pshuflw(auVar254,auVar345,0xe8);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar44);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0xad4] = 0x18;
      }
      auVar123._4_4_ = auVar254._0_4_;
      auVar123._0_4_ = auVar254._0_4_;
      auVar123._8_4_ = auVar254._8_4_;
      auVar123._12_4_ = auVar254._8_4_;
      auVar345 = auVar344 & auVar123 | auVar345;
      auVar295 = packssdw(auVar345,auVar345);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar45);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._4_2_ >> 8 & 1) != 0) {
        psVar156[-0x9d8] = 0x18;
      }
      auVar162 = (auVar277 | auVar150) ^ auVar147;
      auVar255._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar255._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar255._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar255._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar346._4_4_ = auVar255._0_4_;
      auVar346._0_4_ = auVar255._0_4_;
      auVar346._8_4_ = auVar255._8_4_;
      auVar346._12_4_ = auVar255._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar124._4_4_ = iVar363;
      auVar124._0_4_ = iVar363;
      auVar124._8_4_ = iVar384;
      auVar124._12_4_ = iVar384;
      auVar379._4_4_ = auVar255._4_4_;
      auVar379._0_4_ = auVar255._4_4_;
      auVar379._8_4_ = auVar255._12_4_;
      auVar379._12_4_ = auVar255._12_4_;
      auVar162 = auVar124 & auVar346 | auVar379;
      auVar162 = packssdw(auVar162,auVar162);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar46,auVar162 ^ auVar46);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0x8dc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar346,0x84);
      auVar125._4_4_ = iVar363;
      auVar125._0_4_ = iVar363;
      auVar125._8_4_ = iVar384;
      auVar125._12_4_ = iVar384;
      auVar218 = pshufhw(auVar255,auVar125,0x84);
      auVar295 = pshufhw(auVar162,auVar379,0x84);
      auVar201._8_4_ = 0xffffffff;
      auVar201._0_8_ = 0xffffffffffffffff;
      auVar201._12_4_ = 0xffffffff;
      auVar201 = (auVar295 | auVar218 & auVar162) ^ auVar201;
      auVar162 = packssdw(auVar201,auVar201);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._6_2_ >> 8 & 1) != 0) {
        psVar156[-0x7e0] = 0x18;
      }
      auVar162 = (auVar277 | auVar149) ^ auVar147;
      auVar256._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar256._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar256._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar256._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar126._4_4_ = auVar256._0_4_;
      auVar126._0_4_ = auVar256._0_4_;
      auVar126._8_4_ = auVar256._8_4_;
      auVar126._12_4_ = auVar256._8_4_;
      auVar218 = pshuflw(auVar379,auVar126,0xe8);
      auVar202._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar202._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar202._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar202._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar347._4_4_ = auVar202._4_4_;
      auVar347._0_4_ = auVar202._4_4_;
      auVar347._8_4_ = auVar202._12_4_;
      auVar347._12_4_ = auVar202._12_4_;
      auVar162 = pshuflw(auVar202,auVar347,0xe8);
      auVar348._4_4_ = auVar256._4_4_;
      auVar348._0_4_ = auVar256._4_4_;
      auVar348._8_4_ = auVar256._12_4_;
      auVar348._12_4_ = auVar256._12_4_;
      auVar295 = pshuflw(auVar256,auVar348,0xe8);
      auVar257._8_4_ = 0xffffffff;
      auVar257._0_8_ = 0xffffffffffffffff;
      auVar257._12_4_ = 0xffffffff;
      auVar257 = (auVar295 | auVar162 & auVar218) ^ auVar257;
      auVar295 = packssdw(auVar257,auVar257);
      auVar162 = packsswb(auVar162 & auVar218,auVar295);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0x6e4] = 0x18;
      }
      auVar127._4_4_ = auVar256._0_4_;
      auVar127._0_4_ = auVar256._0_4_;
      auVar127._8_4_ = auVar256._8_4_;
      auVar127._12_4_ = auVar256._8_4_;
      auVar348 = auVar347 & auVar127 | auVar348;
      auVar295 = packssdw(auVar348,auVar348);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar295 = packssdw(auVar295 ^ auVar47,auVar295 ^ auVar47);
      auVar162 = packsswb(auVar162,auVar295);
      if ((auVar162._8_2_ >> 8 & 1) != 0) {
        psVar156[-0x5e8] = 0x18;
      }
      auVar162 = (auVar277 | auVar148) ^ auVar147;
      auVar258._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar258._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar258._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar258._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar349._4_4_ = auVar258._0_4_;
      auVar349._0_4_ = auVar258._0_4_;
      auVar349._8_4_ = auVar258._8_4_;
      auVar349._12_4_ = auVar258._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar128._4_4_ = iVar363;
      auVar128._0_4_ = iVar363;
      auVar128._8_4_ = iVar384;
      auVar128._12_4_ = iVar384;
      auVar380._4_4_ = auVar258._4_4_;
      auVar380._0_4_ = auVar258._4_4_;
      auVar380._8_4_ = auVar258._12_4_;
      auVar380._12_4_ = auVar258._12_4_;
      auVar162 = auVar128 & auVar349 | auVar380;
      auVar162 = packssdw(auVar162,auVar162);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar48,auVar162 ^ auVar48);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar156[-0x4ec] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar349,0x84);
      auVar129._4_4_ = iVar363;
      auVar129._0_4_ = iVar363;
      auVar129._8_4_ = iVar384;
      auVar129._12_4_ = iVar384;
      auVar218 = pshufhw(auVar258,auVar129,0x84);
      auVar295 = pshufhw(auVar162,auVar380,0x84);
      auVar203._8_4_ = 0xffffffff;
      auVar203._0_8_ = 0xffffffffffffffff;
      auVar203._12_4_ = 0xffffffff;
      auVar203 = (auVar295 | auVar218 & auVar162) ^ auVar203;
      auVar162 = packssdw(auVar203,auVar203);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._10_2_ >> 8 & 1) != 0) {
        psVar156[-0x3f0] = 0x18;
      }
      auVar162 = (auVar277 | _DAT_002adfd0) ^ auVar147;
      auVar259._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar259._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar259._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar259._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar130._4_4_ = auVar259._0_4_;
      auVar130._0_4_ = auVar259._0_4_;
      auVar130._8_4_ = auVar259._8_4_;
      auVar130._12_4_ = auVar259._8_4_;
      auVar218 = pshuflw(auVar380,auVar130,0xe8);
      auVar204._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar204._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar204._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar204._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar350._4_4_ = auVar204._4_4_;
      auVar350._0_4_ = auVar204._4_4_;
      auVar350._8_4_ = auVar204._12_4_;
      auVar350._12_4_ = auVar204._12_4_;
      auVar162 = pshuflw(auVar204,auVar350,0xe8);
      auVar377._4_4_ = auVar259._4_4_;
      auVar377._0_4_ = auVar259._4_4_;
      auVar377._8_4_ = auVar259._12_4_;
      auVar377._12_4_ = auVar259._12_4_;
      auVar295 = pshuflw(auVar259,auVar377,0xe8);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar49);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x2f4] = 0x18;
      }
      auVar131._4_4_ = auVar259._0_4_;
      auVar131._0_4_ = auVar259._0_4_;
      auVar131._8_4_ = auVar259._8_4_;
      auVar131._12_4_ = auVar259._8_4_;
      auVar295 = auVar350 & auVar131 | auVar377;
      auVar295 = packssdw(auVar295,auVar295);
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar50);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._12_2_ >> 8 & 1) != 0) {
        psVar156[-0x1f8] = 0x18;
      }
      auVar162 = (auVar277 | _DAT_002adfc0) ^ auVar147;
      auVar205._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar205._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar205._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar205._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar351._4_4_ = auVar205._0_4_;
      auVar351._0_4_ = auVar205._0_4_;
      auVar351._8_4_ = auVar205._8_4_;
      auVar351._12_4_ = auVar205._8_4_;
      auVar278._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar278._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar278._0_4_ = auVar278._4_4_;
      auVar278._8_4_ = auVar278._12_4_;
      auVar291._4_4_ = auVar205._4_4_;
      auVar291._0_4_ = auVar205._4_4_;
      auVar291._8_4_ = auVar205._12_4_;
      auVar291._12_4_ = auVar205._12_4_;
      auVar295 = auVar278 & auVar351 | auVar291;
      auVar162 = packssdw(auVar205,auVar295);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar51,auVar162 ^ auVar51);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0xfc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar351,0x84);
      auVar218 = pshufhw(auVar295,auVar278,0x84);
      auVar295 = pshufhw(auVar162,auVar291,0x84);
      auVar206._8_4_ = 0xffffffff;
      auVar206._0_8_ = 0xffffffffffffffff;
      auVar206._12_4_ = 0xffffffff;
      auVar206 = (auVar295 | auVar218 & auVar162) ^ auVar206;
      auVar162 = packssdw(auVar206,auVar206);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._14_2_ >> 8 & 1) != 0) {
        *psVar156 = '\x18';
      }
      uVar159 = uVar159 + 0x10;
      psVar156 = psVar156 + 0xfc0;
    } while (((uVar160 & 0xffffffff) + 0x10 & 0x1fffffff0) != uVar159);
    if (y2 < iVar154) {
      iVar154 = y2;
    }
    uVar153 = y1 + y2 + iVar282 + iVar154 * -2;
    psVar156 = &lev->locations[lVar157][(long)iVar154 + 0xf].typ;
    uVar160 = 0;
    do {
      auVar279._8_4_ = (int)uVar160;
      auVar279._0_8_ = uVar160;
      auVar279._12_4_ = (int)(uVar160 >> 0x20);
      auVar292._4_4_ = 0;
      auVar292._0_4_ = uVar153;
      auVar292._8_4_ = uVar153;
      auVar292._12_4_ = 0;
      auVar292 = auVar292 ^ auVar147;
      auVar162 = (auVar279 | auVar146) ^ auVar147;
      iVar282 = auVar292._0_4_;
      auVar260._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      iVar281 = auVar292._4_4_;
      auVar260._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      iVar154 = auVar292._8_4_;
      auVar260._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      iVar294 = auVar292._12_4_;
      auVar260._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar132._4_4_ = auVar260._0_4_;
      auVar132._0_4_ = auVar260._0_4_;
      auVar132._8_4_ = auVar260._8_4_;
      auVar132._12_4_ = auVar260._8_4_;
      auVar218 = pshuflw(auVar377,auVar132,0xe8);
      auVar207._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar207._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar207._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar207._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar352._4_4_ = auVar207._4_4_;
      auVar352._0_4_ = auVar207._4_4_;
      auVar352._8_4_ = auVar207._12_4_;
      auVar352._12_4_ = auVar207._12_4_;
      auVar162 = pshuflw(auVar207,auVar352,0xe8);
      auVar353._4_4_ = auVar260._4_4_;
      auVar353._0_4_ = auVar260._4_4_;
      auVar353._8_4_ = auVar260._12_4_;
      auVar353._12_4_ = auVar260._12_4_;
      auVar295 = pshuflw(auVar260,auVar353,0xe8);
      auVar261._8_4_ = 0xffffffff;
      auVar261._0_8_ = 0xffffffffffffffff;
      auVar261._12_4_ = 0xffffffff;
      auVar261 = (auVar295 | auVar162 & auVar218) ^ auVar261;
      auVar162 = packssdw(auVar261,auVar261);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0xb4] = 0x18;
      }
      auVar133._4_4_ = auVar260._0_4_;
      auVar133._0_4_ = auVar260._0_4_;
      auVar133._8_4_ = auVar260._8_4_;
      auVar133._12_4_ = auVar260._8_4_;
      auVar353 = auVar352 & auVar133 | auVar353;
      auVar162 = packssdw(auVar353,auVar353);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar52,auVar162 ^ auVar52);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 8 & 1) != 0) {
        psVar156[-0xa8] = 0x18;
      }
      auVar162 = (auVar279 | auVar152) ^ auVar147;
      auVar262._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar262._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar262._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar262._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar354._4_4_ = auVar262._0_4_;
      auVar354._0_4_ = auVar262._0_4_;
      auVar354._8_4_ = auVar262._8_4_;
      auVar354._12_4_ = auVar262._8_4_;
      iVar216 = -(uint)(auVar162._4_4_ == iVar281);
      iVar217 = -(uint)(auVar162._12_4_ == iVar294);
      auVar134._4_4_ = iVar216;
      auVar134._0_4_ = iVar216;
      auVar134._8_4_ = iVar217;
      auVar134._12_4_ = iVar217;
      auVar381._4_4_ = auVar262._4_4_;
      auVar381._0_4_ = auVar262._4_4_;
      auVar381._8_4_ = auVar262._12_4_;
      auVar381._12_4_ = auVar262._12_4_;
      auVar162 = auVar134 & auVar354 | auVar381;
      auVar162 = packssdw(auVar162,auVar162);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar53,auVar162 ^ auVar53);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x10 & 1) != 0) {
        psVar156[-0x9c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar354,0x84);
      auVar135._4_4_ = iVar216;
      auVar135._0_4_ = iVar216;
      auVar135._8_4_ = iVar217;
      auVar135._12_4_ = iVar217;
      auVar218 = pshufhw(auVar262,auVar135,0x84);
      auVar295 = pshufhw(auVar162,auVar381,0x84);
      auVar208._8_4_ = 0xffffffff;
      auVar208._0_8_ = 0xffffffffffffffff;
      auVar208._12_4_ = 0xffffffff;
      auVar208 = (auVar295 | auVar218 & auVar162) ^ auVar208;
      auVar162 = packssdw(auVar208,auVar208);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x18 & 1) != 0) {
        psVar156[-0x90] = 0x18;
      }
      auVar162 = (auVar279 | auVar151) ^ auVar147;
      auVar263._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar263._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar263._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar263._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar136._4_4_ = auVar263._0_4_;
      auVar136._0_4_ = auVar263._0_4_;
      auVar136._8_4_ = auVar263._8_4_;
      auVar136._12_4_ = auVar263._8_4_;
      auVar218 = pshuflw(auVar381,auVar136,0xe8);
      auVar209._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar209._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar209._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar209._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar355._4_4_ = auVar209._4_4_;
      auVar355._0_4_ = auVar209._4_4_;
      auVar355._8_4_ = auVar209._12_4_;
      auVar355._12_4_ = auVar209._12_4_;
      auVar162 = pshuflw(auVar209,auVar355,0xe8);
      auVar356._4_4_ = auVar263._4_4_;
      auVar356._0_4_ = auVar263._4_4_;
      auVar356._8_4_ = auVar263._12_4_;
      auVar356._12_4_ = auVar263._12_4_;
      auVar295 = pshuflw(auVar263,auVar356,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar54);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x84] = 0x18;
      }
      auVar137._4_4_ = auVar263._0_4_;
      auVar137._0_4_ = auVar263._0_4_;
      auVar137._8_4_ = auVar263._8_4_;
      auVar137._12_4_ = auVar263._8_4_;
      auVar356 = auVar355 & auVar137 | auVar356;
      auVar295 = packssdw(auVar356,auVar356);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar55);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._4_2_ >> 8 & 1) != 0) {
        psVar156[-0x78] = 0x18;
      }
      auVar162 = (auVar279 | auVar150) ^ auVar147;
      auVar264._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar264._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar264._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar264._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar357._4_4_ = auVar264._0_4_;
      auVar357._0_4_ = auVar264._0_4_;
      auVar357._8_4_ = auVar264._8_4_;
      auVar357._12_4_ = auVar264._8_4_;
      iVar216 = -(uint)(auVar162._4_4_ == iVar281);
      iVar217 = -(uint)(auVar162._12_4_ == iVar294);
      auVar138._4_4_ = iVar216;
      auVar138._0_4_ = iVar216;
      auVar138._8_4_ = iVar217;
      auVar138._12_4_ = iVar217;
      auVar382._4_4_ = auVar264._4_4_;
      auVar382._0_4_ = auVar264._4_4_;
      auVar382._8_4_ = auVar264._12_4_;
      auVar382._12_4_ = auVar264._12_4_;
      auVar162 = auVar138 & auVar357 | auVar382;
      auVar162 = packssdw(auVar162,auVar162);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar56,auVar162 ^ auVar56);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0x6c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar357,0x84);
      auVar139._4_4_ = iVar216;
      auVar139._0_4_ = iVar216;
      auVar139._8_4_ = iVar217;
      auVar139._12_4_ = iVar217;
      auVar218 = pshufhw(auVar264,auVar139,0x84);
      auVar295 = pshufhw(auVar162,auVar382,0x84);
      auVar210._8_4_ = 0xffffffff;
      auVar210._0_8_ = 0xffffffffffffffff;
      auVar210._12_4_ = 0xffffffff;
      auVar210 = (auVar295 | auVar218 & auVar162) ^ auVar210;
      auVar162 = packssdw(auVar210,auVar210);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._6_2_ >> 8 & 1) != 0) {
        psVar156[-0x60] = 0x18;
      }
      auVar162 = (auVar279 | auVar149) ^ auVar147;
      auVar265._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar265._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar265._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar265._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar140._4_4_ = auVar265._0_4_;
      auVar140._0_4_ = auVar265._0_4_;
      auVar140._8_4_ = auVar265._8_4_;
      auVar140._12_4_ = auVar265._8_4_;
      auVar218 = pshuflw(auVar382,auVar140,0xe8);
      auVar211._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar211._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar211._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar211._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar358._4_4_ = auVar211._4_4_;
      auVar358._0_4_ = auVar211._4_4_;
      auVar358._8_4_ = auVar211._12_4_;
      auVar358._12_4_ = auVar211._12_4_;
      auVar162 = pshuflw(auVar211,auVar358,0xe8);
      auVar359._4_4_ = auVar265._4_4_;
      auVar359._0_4_ = auVar265._4_4_;
      auVar359._8_4_ = auVar265._12_4_;
      auVar359._12_4_ = auVar265._12_4_;
      auVar295 = pshuflw(auVar265,auVar359,0xe8);
      auVar266._8_4_ = 0xffffffff;
      auVar266._0_8_ = 0xffffffffffffffff;
      auVar266._12_4_ = 0xffffffff;
      auVar266 = (auVar295 | auVar162 & auVar218) ^ auVar266;
      auVar295 = packssdw(auVar266,auVar266);
      auVar162 = packsswb(auVar162 & auVar218,auVar295);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0x54] = 0x18;
      }
      auVar141._4_4_ = auVar265._0_4_;
      auVar141._0_4_ = auVar265._0_4_;
      auVar141._8_4_ = auVar265._8_4_;
      auVar141._12_4_ = auVar265._8_4_;
      auVar359 = auVar358 & auVar141 | auVar359;
      auVar295 = packssdw(auVar359,auVar359);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar295 = packssdw(auVar295 ^ auVar57,auVar295 ^ auVar57);
      auVar162 = packsswb(auVar162,auVar295);
      if ((auVar162._8_2_ >> 8 & 1) != 0) {
        psVar156[-0x48] = 0x18;
      }
      auVar162 = (auVar279 | auVar148) ^ auVar147;
      auVar267._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar267._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar267._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar267._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar360._4_4_ = auVar267._0_4_;
      auVar360._0_4_ = auVar267._0_4_;
      auVar360._8_4_ = auVar267._8_4_;
      auVar360._12_4_ = auVar267._8_4_;
      iVar216 = -(uint)(auVar162._4_4_ == iVar281);
      iVar217 = -(uint)(auVar162._12_4_ == iVar294);
      auVar142._4_4_ = iVar216;
      auVar142._0_4_ = iVar216;
      auVar142._8_4_ = iVar217;
      auVar142._12_4_ = iVar217;
      auVar383._4_4_ = auVar267._4_4_;
      auVar383._0_4_ = auVar267._4_4_;
      auVar383._8_4_ = auVar267._12_4_;
      auVar383._12_4_ = auVar267._12_4_;
      auVar162 = auVar142 & auVar360 | auVar383;
      auVar162 = packssdw(auVar162,auVar162);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar58,auVar162 ^ auVar58);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar156[-0x3c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar360,0x84);
      auVar143._4_4_ = iVar216;
      auVar143._0_4_ = iVar216;
      auVar143._8_4_ = iVar217;
      auVar143._12_4_ = iVar217;
      auVar218 = pshufhw(auVar267,auVar143,0x84);
      auVar295 = pshufhw(auVar162,auVar383,0x84);
      auVar212._8_4_ = 0xffffffff;
      auVar212._0_8_ = 0xffffffffffffffff;
      auVar212._12_4_ = 0xffffffff;
      auVar212 = (auVar295 | auVar218 & auVar162) ^ auVar212;
      auVar162 = packssdw(auVar212,auVar212);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._10_2_ >> 8 & 1) != 0) {
        psVar156[-0x30] = 0x18;
      }
      auVar162 = (auVar279 | _DAT_002adfd0) ^ auVar147;
      auVar268._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar268._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar268._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar268._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar144._4_4_ = auVar268._0_4_;
      auVar144._0_4_ = auVar268._0_4_;
      auVar144._8_4_ = auVar268._8_4_;
      auVar144._12_4_ = auVar268._8_4_;
      auVar218 = pshuflw(auVar383,auVar144,0xe8);
      auVar213._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar213._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar213._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar213._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar361._4_4_ = auVar213._4_4_;
      auVar361._0_4_ = auVar213._4_4_;
      auVar361._8_4_ = auVar213._12_4_;
      auVar361._12_4_ = auVar213._12_4_;
      auVar162 = pshuflw(auVar213,auVar361,0xe8);
      auVar377._4_4_ = auVar268._4_4_;
      auVar377._0_4_ = auVar268._4_4_;
      auVar377._8_4_ = auVar268._12_4_;
      auVar377._12_4_ = auVar268._12_4_;
      auVar295 = pshuflw(auVar268,auVar377,0xe8);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar59);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x24] = 0x18;
      }
      auVar145._4_4_ = auVar268._0_4_;
      auVar145._0_4_ = auVar268._0_4_;
      auVar145._8_4_ = auVar268._8_4_;
      auVar145._12_4_ = auVar268._8_4_;
      auVar295 = auVar361 & auVar145 | auVar377;
      auVar295 = packssdw(auVar295,auVar295);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar60);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._12_2_ >> 8 & 1) != 0) {
        psVar156[-0x18] = 0x18;
      }
      auVar162 = (auVar279 | _DAT_002adfc0) ^ auVar147;
      auVar214._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar214._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar214._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar214._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar362._4_4_ = auVar214._0_4_;
      auVar362._0_4_ = auVar214._0_4_;
      auVar362._8_4_ = auVar214._8_4_;
      auVar362._12_4_ = auVar214._8_4_;
      auVar280._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar280._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar280._0_4_ = auVar280._4_4_;
      auVar280._8_4_ = auVar280._12_4_;
      auVar293._4_4_ = auVar214._4_4_;
      auVar293._0_4_ = auVar214._4_4_;
      auVar293._8_4_ = auVar214._12_4_;
      auVar293._12_4_ = auVar214._12_4_;
      auVar295 = auVar280 & auVar362 | auVar293;
      auVar162 = packssdw(auVar214,auVar295);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar61,auVar162 ^ auVar61);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0xc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar362,0x84);
      auVar218 = pshufhw(auVar295,auVar280,0x84);
      auVar295 = pshufhw(auVar162,auVar293,0x84);
      auVar215._8_4_ = 0xffffffff;
      auVar215._0_8_ = 0xffffffffffffffff;
      auVar215._12_4_ = 0xffffffff;
      auVar215 = (auVar295 | auVar218 & auVar162) ^ auVar215;
      auVar162 = packssdw(auVar215,auVar215);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._14_2_ >> 8 & 1) != 0) {
        *psVar156 = '\x18';
      }
      uVar160 = uVar160 + 0x10;
      psVar156 = psVar156 + 0xc0;
    } while (((ulong)uVar153 + 0x10 & 0xfffffffffffffff0) != uVar160);
  }
  else {
    uVar160 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = CONCAT44(0,uVar153);
    iVar282 = SUB164(auVar1 % SEXT816((long)((x2 - x1) + 1)),0);
    iVar154 = iVar282 + x1;
    iVar281 = iVar154;
    if (iVar154 < x1) {
      iVar281 = x1;
    }
    uVar153 = iVar281 - x1;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = CONCAT44(0,uVar153);
    psVar156 = &lev->locations[lVar155 + 0xf][lVar158].typ;
    do {
      auVar269._8_4_ = (int)uVar160;
      auVar269._0_8_ = uVar160;
      auVar269._12_4_ = (int)(uVar160 >> 0x20);
      auVar283._4_4_ = 0;
      auVar283._0_4_ = uVar153;
      auVar283._8_4_ = uVar153;
      auVar283._12_4_ = 0;
      auVar283 = auVar283 ^ auVar147;
      auVar295 = (auVar269 | auVar146) ^ auVar147;
      iVar281 = auVar283._0_4_;
      iVar363 = -(uint)(iVar281 < auVar295._0_4_);
      iVar294 = auVar283._4_4_;
      auVar297._4_4_ = -(uint)(iVar294 < auVar295._4_4_);
      iVar216 = auVar283._8_4_;
      iVar384 = -(uint)(iVar216 < auVar295._8_4_);
      iVar217 = auVar283._12_4_;
      auVar297._12_4_ = -(uint)(iVar217 < auVar295._12_4_);
      auVar62._4_4_ = iVar363;
      auVar62._0_4_ = iVar363;
      auVar62._8_4_ = iVar384;
      auVar62._12_4_ = iVar384;
      auVar162 = pshuflw(auVar161,auVar62,0xe8);
      auVar296._4_4_ = -(uint)(auVar295._4_4_ == iVar294);
      auVar296._12_4_ = -(uint)(auVar295._12_4_ == iVar217);
      auVar296._0_4_ = auVar296._4_4_;
      auVar296._8_4_ = auVar296._12_4_;
      auVar218 = pshuflw(in_XMM1,auVar296,0xe8);
      auVar297._0_4_ = auVar297._4_4_;
      auVar297._8_4_ = auVar297._12_4_;
      auVar295 = pshuflw(auVar162,auVar297,0xe8);
      auVar163._8_4_ = 0xffffffff;
      auVar163._0_8_ = 0xffffffffffffffff;
      auVar163._12_4_ = 0xffffffff;
      auVar163 = (auVar295 | auVar218 & auVar162) ^ auVar163;
      auVar162 = packssdw(auVar163,auVar163);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0xec4] = 0x18;
      }
      auVar63._4_4_ = iVar363;
      auVar63._0_4_ = iVar363;
      auVar63._8_4_ = iVar384;
      auVar63._12_4_ = iVar384;
      auVar297 = auVar296 & auVar63 | auVar297;
      auVar162 = packssdw(auVar297,auVar297);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar2,auVar162 ^ auVar2);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 8 & 1) != 0) {
        psVar156[-0xdc8] = 0x18;
      }
      auVar162 = (auVar269 | auVar152) ^ auVar147;
      auVar219._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar219._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar219._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar219._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar298._4_4_ = auVar219._0_4_;
      auVar298._0_4_ = auVar219._0_4_;
      auVar298._8_4_ = auVar219._8_4_;
      auVar298._12_4_ = auVar219._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar64._4_4_ = iVar363;
      auVar64._0_4_ = iVar363;
      auVar64._8_4_ = iVar384;
      auVar64._12_4_ = iVar384;
      auVar364._4_4_ = auVar219._4_4_;
      auVar364._0_4_ = auVar219._4_4_;
      auVar364._8_4_ = auVar219._12_4_;
      auVar364._12_4_ = auVar219._12_4_;
      auVar162 = auVar64 & auVar298 | auVar364;
      auVar162 = packssdw(auVar162,auVar162);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar3,auVar162 ^ auVar3);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x10 & 1) != 0) {
        psVar156[-0xccc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar298,0x84);
      auVar65._4_4_ = iVar363;
      auVar65._0_4_ = iVar363;
      auVar65._8_4_ = iVar384;
      auVar65._12_4_ = iVar384;
      auVar218 = pshufhw(auVar219,auVar65,0x84);
      auVar295 = pshufhw(auVar162,auVar364,0x84);
      auVar164._8_4_ = 0xffffffff;
      auVar164._0_8_ = 0xffffffffffffffff;
      auVar164._12_4_ = 0xffffffff;
      auVar164 = (auVar295 | auVar218 & auVar162) ^ auVar164;
      auVar162 = packssdw(auVar164,auVar164);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x18 & 1) != 0) {
        psVar156[-0xbd0] = 0x18;
      }
      auVar162 = (auVar269 | auVar151) ^ auVar147;
      auVar220._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar220._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar220._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar220._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar66._4_4_ = auVar220._0_4_;
      auVar66._0_4_ = auVar220._0_4_;
      auVar66._8_4_ = auVar220._8_4_;
      auVar66._12_4_ = auVar220._8_4_;
      auVar218 = pshuflw(auVar364,auVar66,0xe8);
      auVar165._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar165._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar165._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar165._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar299._4_4_ = auVar165._4_4_;
      auVar299._0_4_ = auVar165._4_4_;
      auVar299._8_4_ = auVar165._12_4_;
      auVar299._12_4_ = auVar165._12_4_;
      auVar162 = pshuflw(auVar165,auVar299,0xe8);
      auVar300._4_4_ = auVar220._4_4_;
      auVar300._0_4_ = auVar220._4_4_;
      auVar300._8_4_ = auVar220._12_4_;
      auVar300._12_4_ = auVar220._12_4_;
      auVar295 = pshuflw(auVar220,auVar300,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar4);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0xad4] = 0x18;
      }
      auVar67._4_4_ = auVar220._0_4_;
      auVar67._0_4_ = auVar220._0_4_;
      auVar67._8_4_ = auVar220._8_4_;
      auVar67._12_4_ = auVar220._8_4_;
      auVar300 = auVar299 & auVar67 | auVar300;
      auVar295 = packssdw(auVar300,auVar300);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar5);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._4_2_ >> 8 & 1) != 0) {
        psVar156[-0x9d8] = 0x18;
      }
      auVar162 = (auVar269 | auVar150) ^ auVar147;
      auVar221._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar221._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar221._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar221._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar301._4_4_ = auVar221._0_4_;
      auVar301._0_4_ = auVar221._0_4_;
      auVar301._8_4_ = auVar221._8_4_;
      auVar301._12_4_ = auVar221._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar68._4_4_ = iVar363;
      auVar68._0_4_ = iVar363;
      auVar68._8_4_ = iVar384;
      auVar68._12_4_ = iVar384;
      auVar365._4_4_ = auVar221._4_4_;
      auVar365._0_4_ = auVar221._4_4_;
      auVar365._8_4_ = auVar221._12_4_;
      auVar365._12_4_ = auVar221._12_4_;
      auVar162 = auVar68 & auVar301 | auVar365;
      auVar162 = packssdw(auVar162,auVar162);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar6,auVar162 ^ auVar6);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0x8dc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar301,0x84);
      auVar69._4_4_ = iVar363;
      auVar69._0_4_ = iVar363;
      auVar69._8_4_ = iVar384;
      auVar69._12_4_ = iVar384;
      auVar218 = pshufhw(auVar221,auVar69,0x84);
      auVar295 = pshufhw(auVar162,auVar365,0x84);
      auVar166._8_4_ = 0xffffffff;
      auVar166._0_8_ = 0xffffffffffffffff;
      auVar166._12_4_ = 0xffffffff;
      auVar166 = (auVar295 | auVar218 & auVar162) ^ auVar166;
      auVar162 = packssdw(auVar166,auVar166);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._6_2_ >> 8 & 1) != 0) {
        psVar156[-0x7e0] = 0x18;
      }
      auVar162 = (auVar269 | auVar149) ^ auVar147;
      auVar222._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar222._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar222._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar222._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar70._4_4_ = auVar222._0_4_;
      auVar70._0_4_ = auVar222._0_4_;
      auVar70._8_4_ = auVar222._8_4_;
      auVar70._12_4_ = auVar222._8_4_;
      auVar218 = pshuflw(auVar365,auVar70,0xe8);
      auVar167._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar167._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar167._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar167._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar302._4_4_ = auVar167._4_4_;
      auVar302._0_4_ = auVar167._4_4_;
      auVar302._8_4_ = auVar167._12_4_;
      auVar302._12_4_ = auVar167._12_4_;
      auVar162 = pshuflw(auVar167,auVar302,0xe8);
      auVar303._4_4_ = auVar222._4_4_;
      auVar303._0_4_ = auVar222._4_4_;
      auVar303._8_4_ = auVar222._12_4_;
      auVar303._12_4_ = auVar222._12_4_;
      auVar295 = pshuflw(auVar222,auVar303,0xe8);
      auVar223._8_4_ = 0xffffffff;
      auVar223._0_8_ = 0xffffffffffffffff;
      auVar223._12_4_ = 0xffffffff;
      auVar223 = (auVar295 | auVar162 & auVar218) ^ auVar223;
      auVar295 = packssdw(auVar223,auVar223);
      auVar162 = packsswb(auVar162 & auVar218,auVar295);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0x6e4] = 0x18;
      }
      auVar71._4_4_ = auVar222._0_4_;
      auVar71._0_4_ = auVar222._0_4_;
      auVar71._8_4_ = auVar222._8_4_;
      auVar71._12_4_ = auVar222._8_4_;
      auVar303 = auVar302 & auVar71 | auVar303;
      auVar295 = packssdw(auVar303,auVar303);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar295 = packssdw(auVar295 ^ auVar7,auVar295 ^ auVar7);
      auVar162 = packsswb(auVar162,auVar295);
      if ((auVar162._8_2_ >> 8 & 1) != 0) {
        psVar156[-0x5e8] = 0x18;
      }
      auVar162 = (auVar269 | auVar148) ^ auVar147;
      auVar224._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar224._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar224._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar224._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar304._4_4_ = auVar224._0_4_;
      auVar304._0_4_ = auVar224._0_4_;
      auVar304._8_4_ = auVar224._8_4_;
      auVar304._12_4_ = auVar224._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar72._4_4_ = iVar363;
      auVar72._0_4_ = iVar363;
      auVar72._8_4_ = iVar384;
      auVar72._12_4_ = iVar384;
      auVar366._4_4_ = auVar224._4_4_;
      auVar366._0_4_ = auVar224._4_4_;
      auVar366._8_4_ = auVar224._12_4_;
      auVar366._12_4_ = auVar224._12_4_;
      auVar162 = auVar72 & auVar304 | auVar366;
      auVar162 = packssdw(auVar162,auVar162);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar8,auVar162 ^ auVar8);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar156[-0x4ec] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar304,0x84);
      auVar73._4_4_ = iVar363;
      auVar73._0_4_ = iVar363;
      auVar73._8_4_ = iVar384;
      auVar73._12_4_ = iVar384;
      auVar218 = pshufhw(auVar224,auVar73,0x84);
      auVar295 = pshufhw(auVar162,auVar366,0x84);
      auVar168._8_4_ = 0xffffffff;
      auVar168._0_8_ = 0xffffffffffffffff;
      auVar168._12_4_ = 0xffffffff;
      auVar168 = (auVar295 | auVar218 & auVar162) ^ auVar168;
      auVar162 = packssdw(auVar168,auVar168);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._10_2_ >> 8 & 1) != 0) {
        psVar156[-0x3f0] = 0x18;
      }
      auVar162 = (auVar269 | _DAT_002adfd0) ^ auVar147;
      auVar225._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar225._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar225._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar225._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar74._4_4_ = auVar225._0_4_;
      auVar74._0_4_ = auVar225._0_4_;
      auVar74._8_4_ = auVar225._8_4_;
      auVar74._12_4_ = auVar225._8_4_;
      auVar218 = pshuflw(auVar366,auVar74,0xe8);
      auVar169._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar169._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar169._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar169._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar305._4_4_ = auVar169._4_4_;
      auVar305._0_4_ = auVar169._4_4_;
      auVar305._8_4_ = auVar169._12_4_;
      auVar305._12_4_ = auVar169._12_4_;
      auVar162 = pshuflw(auVar169,auVar305,0xe8);
      auVar367._4_4_ = auVar225._4_4_;
      auVar367._0_4_ = auVar225._4_4_;
      auVar367._8_4_ = auVar225._12_4_;
      auVar367._12_4_ = auVar225._12_4_;
      auVar295 = pshuflw(auVar225,auVar367,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar9);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x2f4] = 0x18;
      }
      auVar75._4_4_ = auVar225._0_4_;
      auVar75._0_4_ = auVar225._0_4_;
      auVar75._8_4_ = auVar225._8_4_;
      auVar75._12_4_ = auVar225._8_4_;
      auVar295 = auVar305 & auVar75 | auVar367;
      auVar295 = packssdw(auVar295,auVar295);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar10);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._12_2_ >> 8 & 1) != 0) {
        psVar156[-0x1f8] = 0x18;
      }
      auVar162 = (auVar269 | _DAT_002adfc0) ^ auVar147;
      auVar170._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar170._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar170._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar170._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar306._4_4_ = auVar170._0_4_;
      auVar306._0_4_ = auVar170._0_4_;
      auVar306._8_4_ = auVar170._8_4_;
      auVar306._12_4_ = auVar170._8_4_;
      auVar270._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar270._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar270._0_4_ = auVar270._4_4_;
      auVar270._8_4_ = auVar270._12_4_;
      auVar284._4_4_ = auVar170._4_4_;
      auVar284._0_4_ = auVar170._4_4_;
      auVar284._8_4_ = auVar170._12_4_;
      auVar284._12_4_ = auVar170._12_4_;
      auVar295 = auVar270 & auVar306 | auVar284;
      auVar162 = packssdw(auVar170,auVar295);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar11,auVar162 ^ auVar11);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0xfc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar306,0x84);
      in_XMM1 = pshufhw(auVar295,auVar270,0x84);
      in_XMM1 = in_XMM1 & auVar162;
      auVar162 = pshufhw(auVar162,auVar284,0x84);
      auVar171._8_4_ = 0xffffffff;
      auVar171._0_8_ = 0xffffffffffffffff;
      auVar171._12_4_ = 0xffffffff;
      auVar171 = (auVar162 | in_XMM1) ^ auVar171;
      auVar162 = packssdw(auVar171,auVar171);
      auVar161 = packsswb(auVar162,auVar162);
      if ((auVar161._14_2_ >> 8 & 1) != 0) {
        *psVar156 = '\x18';
      }
      uVar160 = uVar160 + 0x10;
      psVar156 = psVar156 + 0xfc0;
    } while ((CONCAT44(0,uVar153) + 0x10 & 0x1fffffff0) != uVar160);
    lVar157 = (long)y2;
    lVar155 = lVar158;
    if (lVar157 < lVar158) {
      lVar155 = lVar157;
    }
    uVar159 = lVar158 - lVar157;
    uVar160 = -uVar159;
    if (0 < (long)uVar159) {
      uVar160 = uVar159;
    }
    psVar156 = &lev->locations[iVar154][lVar155 + 0xf].typ;
    uVar159 = 0;
    do {
      auVar271._8_4_ = (int)uVar159;
      auVar271._0_8_ = uVar159;
      auVar271._12_4_ = (int)(uVar159 >> 0x20);
      auVar285._8_4_ = (int)uVar160;
      auVar285._0_8_ = uVar160 & 0xffffffff;
      auVar285._12_4_ = 0;
      auVar285 = auVar285 ^ auVar147;
      auVar162 = (auVar271 | auVar146) ^ auVar147;
      iVar281 = auVar285._0_4_;
      auVar226._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      iVar294 = auVar285._4_4_;
      auVar226._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      iVar216 = auVar285._8_4_;
      auVar226._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      iVar217 = auVar285._12_4_;
      auVar226._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar76._4_4_ = auVar226._0_4_;
      auVar76._0_4_ = auVar226._0_4_;
      auVar76._8_4_ = auVar226._8_4_;
      auVar76._12_4_ = auVar226._8_4_;
      auVar218 = pshuflw(auVar367,auVar76,0xe8);
      auVar172._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar172._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar172._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar172._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar307._4_4_ = auVar172._4_4_;
      auVar307._0_4_ = auVar172._4_4_;
      auVar307._8_4_ = auVar172._12_4_;
      auVar307._12_4_ = auVar172._12_4_;
      auVar162 = pshuflw(auVar172,auVar307,0xe8);
      auVar308._4_4_ = auVar226._4_4_;
      auVar308._0_4_ = auVar226._4_4_;
      auVar308._8_4_ = auVar226._12_4_;
      auVar308._12_4_ = auVar226._12_4_;
      auVar295 = pshuflw(auVar226,auVar308,0xe8);
      auVar227._8_4_ = 0xffffffff;
      auVar227._0_8_ = 0xffffffffffffffff;
      auVar227._12_4_ = 0xffffffff;
      auVar227 = (auVar295 | auVar162 & auVar218) ^ auVar227;
      auVar162 = packssdw(auVar227,auVar227);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0xb4] = 0x18;
      }
      auVar77._4_4_ = auVar226._0_4_;
      auVar77._0_4_ = auVar226._0_4_;
      auVar77._8_4_ = auVar226._8_4_;
      auVar77._12_4_ = auVar226._8_4_;
      auVar308 = auVar307 & auVar77 | auVar308;
      auVar162 = packssdw(auVar308,auVar308);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar12,auVar162 ^ auVar12);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 8 & 1) != 0) {
        psVar156[-0xa8] = 0x18;
      }
      auVar162 = (auVar271 | auVar152) ^ auVar147;
      auVar228._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar228._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar228._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar228._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar309._4_4_ = auVar228._0_4_;
      auVar309._0_4_ = auVar228._0_4_;
      auVar309._8_4_ = auVar228._8_4_;
      auVar309._12_4_ = auVar228._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar78._4_4_ = iVar363;
      auVar78._0_4_ = iVar363;
      auVar78._8_4_ = iVar384;
      auVar78._12_4_ = iVar384;
      auVar368._4_4_ = auVar228._4_4_;
      auVar368._0_4_ = auVar228._4_4_;
      auVar368._8_4_ = auVar228._12_4_;
      auVar368._12_4_ = auVar228._12_4_;
      auVar162 = auVar78 & auVar309 | auVar368;
      auVar162 = packssdw(auVar162,auVar162);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar13,auVar162 ^ auVar13);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x10 & 1) != 0) {
        psVar156[-0x9c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar309,0x84);
      auVar79._4_4_ = iVar363;
      auVar79._0_4_ = iVar363;
      auVar79._8_4_ = iVar384;
      auVar79._12_4_ = iVar384;
      auVar218 = pshufhw(auVar228,auVar79,0x84);
      auVar295 = pshufhw(auVar162,auVar368,0x84);
      auVar173._8_4_ = 0xffffffff;
      auVar173._0_8_ = 0xffffffffffffffff;
      auVar173._12_4_ = 0xffffffff;
      auVar173 = (auVar295 | auVar218 & auVar162) ^ auVar173;
      auVar162 = packssdw(auVar173,auVar173);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x18 & 1) != 0) {
        psVar156[-0x90] = 0x18;
      }
      auVar162 = (auVar271 | auVar151) ^ auVar147;
      auVar229._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar229._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar229._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar229._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar80._4_4_ = auVar229._0_4_;
      auVar80._0_4_ = auVar229._0_4_;
      auVar80._8_4_ = auVar229._8_4_;
      auVar80._12_4_ = auVar229._8_4_;
      auVar218 = pshuflw(auVar368,auVar80,0xe8);
      auVar174._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar174._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar174._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar174._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar310._4_4_ = auVar174._4_4_;
      auVar310._0_4_ = auVar174._4_4_;
      auVar310._8_4_ = auVar174._12_4_;
      auVar310._12_4_ = auVar174._12_4_;
      auVar162 = pshuflw(auVar174,auVar310,0xe8);
      auVar311._4_4_ = auVar229._4_4_;
      auVar311._0_4_ = auVar229._4_4_;
      auVar311._8_4_ = auVar229._12_4_;
      auVar311._12_4_ = auVar229._12_4_;
      auVar295 = pshuflw(auVar229,auVar311,0xe8);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar14);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x84] = 0x18;
      }
      auVar81._4_4_ = auVar229._0_4_;
      auVar81._0_4_ = auVar229._0_4_;
      auVar81._8_4_ = auVar229._8_4_;
      auVar81._12_4_ = auVar229._8_4_;
      auVar311 = auVar310 & auVar81 | auVar311;
      auVar295 = packssdw(auVar311,auVar311);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar15);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._4_2_ >> 8 & 1) != 0) {
        psVar156[-0x78] = 0x18;
      }
      auVar162 = (auVar271 | auVar150) ^ auVar147;
      auVar230._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar230._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar230._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar230._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar312._4_4_ = auVar230._0_4_;
      auVar312._0_4_ = auVar230._0_4_;
      auVar312._8_4_ = auVar230._8_4_;
      auVar312._12_4_ = auVar230._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar82._4_4_ = iVar363;
      auVar82._0_4_ = iVar363;
      auVar82._8_4_ = iVar384;
      auVar82._12_4_ = iVar384;
      auVar369._4_4_ = auVar230._4_4_;
      auVar369._0_4_ = auVar230._4_4_;
      auVar369._8_4_ = auVar230._12_4_;
      auVar369._12_4_ = auVar230._12_4_;
      auVar162 = auVar82 & auVar312 | auVar369;
      auVar162 = packssdw(auVar162,auVar162);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar16,auVar162 ^ auVar16);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0x6c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar312,0x84);
      auVar83._4_4_ = iVar363;
      auVar83._0_4_ = iVar363;
      auVar83._8_4_ = iVar384;
      auVar83._12_4_ = iVar384;
      auVar218 = pshufhw(auVar230,auVar83,0x84);
      auVar295 = pshufhw(auVar162,auVar369,0x84);
      auVar175._8_4_ = 0xffffffff;
      auVar175._0_8_ = 0xffffffffffffffff;
      auVar175._12_4_ = 0xffffffff;
      auVar175 = (auVar295 | auVar218 & auVar162) ^ auVar175;
      auVar162 = packssdw(auVar175,auVar175);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._6_2_ >> 8 & 1) != 0) {
        psVar156[-0x60] = 0x18;
      }
      auVar162 = (auVar271 | auVar149) ^ auVar147;
      auVar231._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar231._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar231._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar231._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar84._4_4_ = auVar231._0_4_;
      auVar84._0_4_ = auVar231._0_4_;
      auVar84._8_4_ = auVar231._8_4_;
      auVar84._12_4_ = auVar231._8_4_;
      auVar218 = pshuflw(auVar369,auVar84,0xe8);
      auVar176._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar176._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar176._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar176._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar313._4_4_ = auVar176._4_4_;
      auVar313._0_4_ = auVar176._4_4_;
      auVar313._8_4_ = auVar176._12_4_;
      auVar313._12_4_ = auVar176._12_4_;
      auVar162 = pshuflw(auVar176,auVar313,0xe8);
      auVar314._4_4_ = auVar231._4_4_;
      auVar314._0_4_ = auVar231._4_4_;
      auVar314._8_4_ = auVar231._12_4_;
      auVar314._12_4_ = auVar231._12_4_;
      auVar295 = pshuflw(auVar231,auVar314,0xe8);
      auVar232._8_4_ = 0xffffffff;
      auVar232._0_8_ = 0xffffffffffffffff;
      auVar232._12_4_ = 0xffffffff;
      auVar232 = (auVar295 | auVar162 & auVar218) ^ auVar232;
      auVar295 = packssdw(auVar232,auVar232);
      auVar162 = packsswb(auVar162 & auVar218,auVar295);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0x54] = 0x18;
      }
      auVar85._4_4_ = auVar231._0_4_;
      auVar85._0_4_ = auVar231._0_4_;
      auVar85._8_4_ = auVar231._8_4_;
      auVar85._12_4_ = auVar231._8_4_;
      auVar314 = auVar313 & auVar85 | auVar314;
      auVar295 = packssdw(auVar314,auVar314);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar295 = packssdw(auVar295 ^ auVar17,auVar295 ^ auVar17);
      auVar162 = packsswb(auVar162,auVar295);
      if ((auVar162._8_2_ >> 8 & 1) != 0) {
        psVar156[-0x48] = 0x18;
      }
      auVar162 = (auVar271 | auVar148) ^ auVar147;
      auVar233._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar233._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar233._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar233._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar315._4_4_ = auVar233._0_4_;
      auVar315._0_4_ = auVar233._0_4_;
      auVar315._8_4_ = auVar233._8_4_;
      auVar315._12_4_ = auVar233._8_4_;
      iVar363 = -(uint)(auVar162._4_4_ == iVar294);
      iVar384 = -(uint)(auVar162._12_4_ == iVar217);
      auVar86._4_4_ = iVar363;
      auVar86._0_4_ = iVar363;
      auVar86._8_4_ = iVar384;
      auVar86._12_4_ = iVar384;
      auVar370._4_4_ = auVar233._4_4_;
      auVar370._0_4_ = auVar233._4_4_;
      auVar370._8_4_ = auVar233._12_4_;
      auVar370._12_4_ = auVar233._12_4_;
      auVar162 = auVar86 & auVar315 | auVar370;
      auVar162 = packssdw(auVar162,auVar162);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar18,auVar162 ^ auVar18);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar156[-0x3c] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar315,0x84);
      auVar87._4_4_ = iVar363;
      auVar87._0_4_ = iVar363;
      auVar87._8_4_ = iVar384;
      auVar87._12_4_ = iVar384;
      auVar218 = pshufhw(auVar233,auVar87,0x84);
      auVar295 = pshufhw(auVar162,auVar370,0x84);
      auVar177._8_4_ = 0xffffffff;
      auVar177._0_8_ = 0xffffffffffffffff;
      auVar177._12_4_ = 0xffffffff;
      auVar177 = (auVar295 | auVar218 & auVar162) ^ auVar177;
      auVar162 = packssdw(auVar177,auVar177);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._10_2_ >> 8 & 1) != 0) {
        psVar156[-0x30] = 0x18;
      }
      auVar162 = (auVar271 | _DAT_002adfd0) ^ auVar147;
      auVar234._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar234._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar234._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar234._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar88._4_4_ = auVar234._0_4_;
      auVar88._0_4_ = auVar234._0_4_;
      auVar88._8_4_ = auVar234._8_4_;
      auVar88._12_4_ = auVar234._8_4_;
      auVar218 = pshuflw(auVar370,auVar88,0xe8);
      auVar178._0_4_ = -(uint)(auVar162._0_4_ == iVar281);
      auVar178._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar178._8_4_ = -(uint)(auVar162._8_4_ == iVar216);
      auVar178._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar316._4_4_ = auVar178._4_4_;
      auVar316._0_4_ = auVar178._4_4_;
      auVar316._8_4_ = auVar178._12_4_;
      auVar316._12_4_ = auVar178._12_4_;
      auVar162 = pshuflw(auVar178,auVar316,0xe8);
      auVar367._4_4_ = auVar234._4_4_;
      auVar367._0_4_ = auVar234._4_4_;
      auVar367._8_4_ = auVar234._12_4_;
      auVar367._12_4_ = auVar234._12_4_;
      auVar295 = pshuflw(auVar234,auVar367,0xe8);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar19);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x24] = 0x18;
      }
      auVar89._4_4_ = auVar234._0_4_;
      auVar89._0_4_ = auVar234._0_4_;
      auVar89._8_4_ = auVar234._8_4_;
      auVar89._12_4_ = auVar234._8_4_;
      auVar295 = auVar316 & auVar89 | auVar367;
      auVar295 = packssdw(auVar295,auVar295);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar20);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._12_2_ >> 8 & 1) != 0) {
        psVar156[-0x18] = 0x18;
      }
      auVar162 = (auVar271 | _DAT_002adfc0) ^ auVar147;
      auVar179._0_4_ = -(uint)(iVar281 < auVar162._0_4_);
      auVar179._4_4_ = -(uint)(iVar294 < auVar162._4_4_);
      auVar179._8_4_ = -(uint)(iVar216 < auVar162._8_4_);
      auVar179._12_4_ = -(uint)(iVar217 < auVar162._12_4_);
      auVar317._4_4_ = auVar179._0_4_;
      auVar317._0_4_ = auVar179._0_4_;
      auVar317._8_4_ = auVar179._8_4_;
      auVar317._12_4_ = auVar179._8_4_;
      auVar272._4_4_ = -(uint)(auVar162._4_4_ == iVar294);
      auVar272._12_4_ = -(uint)(auVar162._12_4_ == iVar217);
      auVar272._0_4_ = auVar272._4_4_;
      auVar272._8_4_ = auVar272._12_4_;
      auVar286._4_4_ = auVar179._4_4_;
      auVar286._0_4_ = auVar179._4_4_;
      auVar286._8_4_ = auVar179._12_4_;
      auVar286._12_4_ = auVar179._12_4_;
      auVar295 = auVar272 & auVar317 | auVar286;
      auVar162 = packssdw(auVar179,auVar295);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar21,auVar162 ^ auVar21);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0xc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar317,0x84);
      auVar218 = pshufhw(auVar295,auVar272,0x84);
      auVar295 = pshufhw(auVar162,auVar286,0x84);
      auVar180._8_4_ = 0xffffffff;
      auVar180._0_8_ = 0xffffffffffffffff;
      auVar180._12_4_ = 0xffffffff;
      auVar180 = (auVar295 | auVar218 & auVar162) ^ auVar180;
      auVar162 = packssdw(auVar180,auVar180);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._14_2_ >> 8 & 1) != 0) {
        *psVar156 = '\x18';
      }
      uVar159 = uVar159 + 0x10;
      psVar156 = psVar156 + 0xc0;
    } while (((uVar160 & 0xffffffff) + 0x10 & 0x1fffffff0) != uVar159);
    if (x2 < iVar154) {
      iVar154 = x2;
    }
    uVar153 = x1 + x2 + iVar282 + iVar154 * -2;
    psVar156 = &lev->locations[(long)iVar154 + 0xf][lVar157].typ;
    uVar160 = 0;
    do {
      auVar273._8_4_ = (int)uVar160;
      auVar273._0_8_ = uVar160;
      auVar273._12_4_ = (int)(uVar160 >> 0x20);
      auVar287._4_4_ = 0;
      auVar287._0_4_ = uVar153;
      auVar287._8_4_ = uVar153;
      auVar287._12_4_ = 0;
      auVar287 = auVar287 ^ auVar147;
      auVar162 = (auVar273 | auVar146) ^ auVar147;
      iVar282 = auVar287._0_4_;
      auVar235._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      iVar281 = auVar287._4_4_;
      auVar235._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      iVar154 = auVar287._8_4_;
      auVar235._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      iVar294 = auVar287._12_4_;
      auVar235._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar90._4_4_ = auVar235._0_4_;
      auVar90._0_4_ = auVar235._0_4_;
      auVar90._8_4_ = auVar235._8_4_;
      auVar90._12_4_ = auVar235._8_4_;
      auVar218 = pshuflw(auVar367,auVar90,0xe8);
      auVar181._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar181._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar181._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar181._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar318._4_4_ = auVar181._4_4_;
      auVar318._0_4_ = auVar181._4_4_;
      auVar318._8_4_ = auVar181._12_4_;
      auVar318._12_4_ = auVar181._12_4_;
      auVar162 = pshuflw(auVar181,auVar318,0xe8);
      auVar319._4_4_ = auVar235._4_4_;
      auVar319._0_4_ = auVar235._4_4_;
      auVar319._8_4_ = auVar235._12_4_;
      auVar319._12_4_ = auVar235._12_4_;
      auVar295 = pshuflw(auVar235,auVar319,0xe8);
      auVar236._8_4_ = 0xffffffff;
      auVar236._0_8_ = 0xffffffffffffffff;
      auVar236._12_4_ = 0xffffffff;
      auVar236 = (auVar295 | auVar162 & auVar218) ^ auVar236;
      auVar162 = packssdw(auVar236,auVar236);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0xec4] = 0x18;
      }
      auVar91._4_4_ = auVar235._0_4_;
      auVar91._0_4_ = auVar235._0_4_;
      auVar91._8_4_ = auVar235._8_4_;
      auVar91._12_4_ = auVar235._8_4_;
      auVar319 = auVar318 & auVar91 | auVar319;
      auVar162 = packssdw(auVar319,auVar319);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar22,auVar162 ^ auVar22);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 8 & 1) != 0) {
        psVar156[-0xdc8] = 0x18;
      }
      auVar162 = (auVar273 | auVar152) ^ auVar147;
      auVar237._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar237._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar237._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar237._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar320._4_4_ = auVar237._0_4_;
      auVar320._0_4_ = auVar237._0_4_;
      auVar320._8_4_ = auVar237._8_4_;
      auVar320._12_4_ = auVar237._8_4_;
      iVar216 = -(uint)(auVar162._4_4_ == iVar281);
      iVar217 = -(uint)(auVar162._12_4_ == iVar294);
      auVar92._4_4_ = iVar216;
      auVar92._0_4_ = iVar216;
      auVar92._8_4_ = iVar217;
      auVar92._12_4_ = iVar217;
      auVar371._4_4_ = auVar237._4_4_;
      auVar371._0_4_ = auVar237._4_4_;
      auVar371._8_4_ = auVar237._12_4_;
      auVar371._12_4_ = auVar237._12_4_;
      auVar162 = auVar92 & auVar320 | auVar371;
      auVar162 = packssdw(auVar162,auVar162);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar23,auVar162 ^ auVar23);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x10 & 1) != 0) {
        psVar156[-0xccc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar320,0x84);
      auVar93._4_4_ = iVar216;
      auVar93._0_4_ = iVar216;
      auVar93._8_4_ = iVar217;
      auVar93._12_4_ = iVar217;
      auVar218 = pshufhw(auVar237,auVar93,0x84);
      auVar295 = pshufhw(auVar162,auVar371,0x84);
      auVar182._8_4_ = 0xffffffff;
      auVar182._0_8_ = 0xffffffffffffffff;
      auVar182._12_4_ = 0xffffffff;
      auVar182 = (auVar295 | auVar218 & auVar162) ^ auVar182;
      auVar162 = packssdw(auVar182,auVar182);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._0_4_ >> 0x18 & 1) != 0) {
        psVar156[-0xbd0] = 0x18;
      }
      auVar162 = (auVar273 | auVar151) ^ auVar147;
      auVar238._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar238._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar238._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar238._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar94._4_4_ = auVar238._0_4_;
      auVar94._0_4_ = auVar238._0_4_;
      auVar94._8_4_ = auVar238._8_4_;
      auVar94._12_4_ = auVar238._8_4_;
      auVar218 = pshuflw(auVar371,auVar94,0xe8);
      auVar183._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar183._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar183._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar183._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar321._4_4_ = auVar183._4_4_;
      auVar321._0_4_ = auVar183._4_4_;
      auVar321._8_4_ = auVar183._12_4_;
      auVar321._12_4_ = auVar183._12_4_;
      auVar162 = pshuflw(auVar183,auVar321,0xe8);
      auVar322._4_4_ = auVar238._4_4_;
      auVar322._0_4_ = auVar238._4_4_;
      auVar322._8_4_ = auVar238._12_4_;
      auVar322._12_4_ = auVar238._12_4_;
      auVar295 = pshuflw(auVar238,auVar322,0xe8);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar24);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0xad4] = 0x18;
      }
      auVar95._4_4_ = auVar238._0_4_;
      auVar95._0_4_ = auVar238._0_4_;
      auVar95._8_4_ = auVar238._8_4_;
      auVar95._12_4_ = auVar238._8_4_;
      auVar322 = auVar321 & auVar95 | auVar322;
      auVar295 = packssdw(auVar322,auVar322);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar25);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._4_2_ >> 8 & 1) != 0) {
        psVar156[-0x9d8] = 0x18;
      }
      auVar162 = (auVar273 | auVar150) ^ auVar147;
      auVar239._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar239._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar239._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar239._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar323._4_4_ = auVar239._0_4_;
      auVar323._0_4_ = auVar239._0_4_;
      auVar323._8_4_ = auVar239._8_4_;
      auVar323._12_4_ = auVar239._8_4_;
      iVar216 = -(uint)(auVar162._4_4_ == iVar281);
      iVar217 = -(uint)(auVar162._12_4_ == iVar294);
      auVar96._4_4_ = iVar216;
      auVar96._0_4_ = iVar216;
      auVar96._8_4_ = iVar217;
      auVar96._12_4_ = iVar217;
      auVar372._4_4_ = auVar239._4_4_;
      auVar372._0_4_ = auVar239._4_4_;
      auVar372._8_4_ = auVar239._12_4_;
      auVar372._12_4_ = auVar239._12_4_;
      auVar162 = auVar96 & auVar323 | auVar372;
      auVar162 = packssdw(auVar162,auVar162);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar26,auVar162 ^ auVar26);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0x8dc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar323,0x84);
      auVar97._4_4_ = iVar216;
      auVar97._0_4_ = iVar216;
      auVar97._8_4_ = iVar217;
      auVar97._12_4_ = iVar217;
      auVar218 = pshufhw(auVar239,auVar97,0x84);
      auVar295 = pshufhw(auVar162,auVar372,0x84);
      auVar184._8_4_ = 0xffffffff;
      auVar184._0_8_ = 0xffffffffffffffff;
      auVar184._12_4_ = 0xffffffff;
      auVar184 = (auVar295 | auVar218 & auVar162) ^ auVar184;
      auVar162 = packssdw(auVar184,auVar184);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._6_2_ >> 8 & 1) != 0) {
        psVar156[-0x7e0] = 0x18;
      }
      auVar162 = (auVar273 | auVar149) ^ auVar147;
      auVar240._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar240._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar240._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar240._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar98._4_4_ = auVar240._0_4_;
      auVar98._0_4_ = auVar240._0_4_;
      auVar98._8_4_ = auVar240._8_4_;
      auVar98._12_4_ = auVar240._8_4_;
      auVar218 = pshuflw(auVar372,auVar98,0xe8);
      auVar185._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar185._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar185._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar185._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar324._4_4_ = auVar185._4_4_;
      auVar324._0_4_ = auVar185._4_4_;
      auVar324._8_4_ = auVar185._12_4_;
      auVar324._12_4_ = auVar185._12_4_;
      auVar162 = pshuflw(auVar185,auVar324,0xe8);
      auVar325._4_4_ = auVar240._4_4_;
      auVar325._0_4_ = auVar240._4_4_;
      auVar325._8_4_ = auVar240._12_4_;
      auVar325._12_4_ = auVar240._12_4_;
      auVar295 = pshuflw(auVar240,auVar325,0xe8);
      auVar241._8_4_ = 0xffffffff;
      auVar241._0_8_ = 0xffffffffffffffff;
      auVar241._12_4_ = 0xffffffff;
      auVar241 = (auVar295 | auVar162 & auVar218) ^ auVar241;
      auVar295 = packssdw(auVar241,auVar241);
      auVar162 = packsswb(auVar162 & auVar218,auVar295);
      if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar156[-0x6e4] = 0x18;
      }
      auVar99._4_4_ = auVar240._0_4_;
      auVar99._0_4_ = auVar240._0_4_;
      auVar99._8_4_ = auVar240._8_4_;
      auVar99._12_4_ = auVar240._8_4_;
      auVar325 = auVar324 & auVar99 | auVar325;
      auVar295 = packssdw(auVar325,auVar325);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar295 = packssdw(auVar295 ^ auVar27,auVar295 ^ auVar27);
      auVar162 = packsswb(auVar162,auVar295);
      if ((auVar162._8_2_ >> 8 & 1) != 0) {
        psVar156[-0x5e8] = 0x18;
      }
      auVar162 = (auVar273 | auVar148) ^ auVar147;
      auVar242._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar242._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar242._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar242._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar326._4_4_ = auVar242._0_4_;
      auVar326._0_4_ = auVar242._0_4_;
      auVar326._8_4_ = auVar242._8_4_;
      auVar326._12_4_ = auVar242._8_4_;
      iVar216 = -(uint)(auVar162._4_4_ == iVar281);
      iVar217 = -(uint)(auVar162._12_4_ == iVar294);
      auVar100._4_4_ = iVar216;
      auVar100._0_4_ = iVar216;
      auVar100._8_4_ = iVar217;
      auVar100._12_4_ = iVar217;
      auVar373._4_4_ = auVar242._4_4_;
      auVar373._0_4_ = auVar242._4_4_;
      auVar373._8_4_ = auVar242._12_4_;
      auVar373._12_4_ = auVar242._12_4_;
      auVar162 = auVar100 & auVar326 | auVar373;
      auVar162 = packssdw(auVar162,auVar162);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar28,auVar162 ^ auVar28);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar156[-0x4ec] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar326,0x84);
      auVar101._4_4_ = iVar216;
      auVar101._0_4_ = iVar216;
      auVar101._8_4_ = iVar217;
      auVar101._12_4_ = iVar217;
      auVar218 = pshufhw(auVar242,auVar101,0x84);
      auVar295 = pshufhw(auVar162,auVar373,0x84);
      auVar186._8_4_ = 0xffffffff;
      auVar186._0_8_ = 0xffffffffffffffff;
      auVar186._12_4_ = 0xffffffff;
      auVar186 = (auVar295 | auVar218 & auVar162) ^ auVar186;
      auVar162 = packssdw(auVar186,auVar186);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._10_2_ >> 8 & 1) != 0) {
        psVar156[-0x3f0] = 0x18;
      }
      auVar162 = (auVar273 | _DAT_002adfd0) ^ auVar147;
      auVar243._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar243._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar243._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar243._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar102._4_4_ = auVar243._0_4_;
      auVar102._0_4_ = auVar243._0_4_;
      auVar102._8_4_ = auVar243._8_4_;
      auVar102._12_4_ = auVar243._8_4_;
      auVar218 = pshuflw(auVar373,auVar102,0xe8);
      auVar187._0_4_ = -(uint)(auVar162._0_4_ == iVar282);
      auVar187._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar187._8_4_ = -(uint)(auVar162._8_4_ == iVar154);
      auVar187._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar327._4_4_ = auVar187._4_4_;
      auVar327._0_4_ = auVar187._4_4_;
      auVar327._8_4_ = auVar187._12_4_;
      auVar327._12_4_ = auVar187._12_4_;
      auVar162 = pshuflw(auVar187,auVar327,0xe8);
      auVar367._4_4_ = auVar243._4_4_;
      auVar367._0_4_ = auVar243._4_4_;
      auVar367._8_4_ = auVar243._12_4_;
      auVar367._12_4_ = auVar243._12_4_;
      auVar295 = pshuflw(auVar243,auVar367,0xe8);
      auVar29._8_4_ = 0xffffffff;
      auVar29._0_8_ = 0xffffffffffffffff;
      auVar29._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 & auVar218,(auVar295 | auVar162 & auVar218) ^ auVar29);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar156[-0x2f4] = 0x18;
      }
      auVar103._4_4_ = auVar243._0_4_;
      auVar103._0_4_ = auVar243._0_4_;
      auVar103._8_4_ = auVar243._8_4_;
      auVar103._12_4_ = auVar243._8_4_;
      auVar295 = auVar327 & auVar103 | auVar367;
      auVar295 = packssdw(auVar295,auVar295);
      auVar30._8_4_ = 0xffffffff;
      auVar30._0_8_ = 0xffffffffffffffff;
      auVar30._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162,auVar295 ^ auVar30);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._12_2_ >> 8 & 1) != 0) {
        psVar156[-0x1f8] = 0x18;
      }
      auVar162 = (auVar273 | _DAT_002adfc0) ^ auVar147;
      auVar188._0_4_ = -(uint)(iVar282 < auVar162._0_4_);
      auVar188._4_4_ = -(uint)(iVar281 < auVar162._4_4_);
      auVar188._8_4_ = -(uint)(iVar154 < auVar162._8_4_);
      auVar188._12_4_ = -(uint)(iVar294 < auVar162._12_4_);
      auVar328._4_4_ = auVar188._0_4_;
      auVar328._0_4_ = auVar188._0_4_;
      auVar328._8_4_ = auVar188._8_4_;
      auVar328._12_4_ = auVar188._8_4_;
      auVar274._4_4_ = -(uint)(auVar162._4_4_ == iVar281);
      auVar274._12_4_ = -(uint)(auVar162._12_4_ == iVar294);
      auVar274._0_4_ = auVar274._4_4_;
      auVar274._8_4_ = auVar274._12_4_;
      auVar288._4_4_ = auVar188._4_4_;
      auVar288._0_4_ = auVar188._4_4_;
      auVar288._8_4_ = auVar188._12_4_;
      auVar288._12_4_ = auVar188._12_4_;
      auVar295 = auVar274 & auVar328 | auVar288;
      auVar162 = packssdw(auVar188,auVar295);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar162 = packssdw(auVar162 ^ auVar31,auVar162 ^ auVar31);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar156[-0xfc] = 0x18;
      }
      auVar162 = pshufhw(auVar162,auVar328,0x84);
      auVar218 = pshufhw(auVar295,auVar274,0x84);
      auVar295 = pshufhw(auVar162,auVar288,0x84);
      auVar189._8_4_ = 0xffffffff;
      auVar189._0_8_ = 0xffffffffffffffff;
      auVar189._12_4_ = 0xffffffff;
      auVar189 = (auVar295 | auVar218 & auVar162) ^ auVar189;
      auVar162 = packssdw(auVar189,auVar189);
      auVar162 = packsswb(auVar162,auVar162);
      if ((auVar162._14_2_ >> 8 & 1) != 0) {
        *psVar156 = '\x18';
      }
      uVar160 = uVar160 + 0x10;
      psVar156 = psVar156 + 0xfc0;
    } while (((ulong)uVar153 + 0x10 & 0xfffffffffffffff0) != uVar160);
  }
  return;
}

Assistant:

static void roguejoin(struct level *lev, int x1, int y1, int x2, int y2, int horiz)
{
	int x,y,middle;
#ifndef MAX
#define MAX(a,b) (((a) > (b)) ? (a) : (b))
#endif
#ifndef MIN
#define MIN(a,b) (((a) < (b)) ? (a) : (b))
#endif
	if (horiz) {
		middle = x1 + rn2(x2-x1+1);
		for (x=MIN(x1,middle); x<=MAX(x1,middle); x++)
			corr(lev, x, y1);
		for (y=MIN(y1,y2); y<=MAX(y1,y2); y++)
			corr(lev, middle,y);
		for (x=MIN(middle,x2); x<=MAX(middle,x2); x++)
			corr(lev, x, y2);
	} else {
		middle = y1 + rn2(y2-y1+1);
		for (y=MIN(y1,middle); y<=MAX(y1,middle); y++)
			corr(lev, x1, y);
		for (x=MIN(x1,x2); x<=MAX(x1,x2); x++)
			corr(lev, x, middle);
		for (y=MIN(middle,y2); y<=MAX(middle,y2); y++)
			corr(lev, x2,y);
	}
}